

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTableSet(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  anon_class_8_1_8991fb9c local_30;
  anon_class_8_1_8991fb9c makeTableSet;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  makeTableSet.this._4_4_ = 0;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&makeTableSet.this + 4));
  if (!bVar1) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x127b,"Expression *wasm::TranslateToFuzzReader::makeTableSet(Type)");
  }
  local_30.this = this;
  bVar1 = IString::operator_cast_to_bool(&(this->exnrefTableName).super_IString);
  if ((bVar1) && (bVar1 = oneIn(this,2), bVar1)) {
    type_local.id =
         (uintptr_t)
         TranslateToFuzzReader::makeTableSet::anon_class_8_1_8991fb9c::operator()
                   (&local_30,(Name)(this->exnrefTableName).super_IString.str);
  }
  else {
    bVar1 = IString::operator_cast_to_bool(&(this->funcrefTableName).super_IString);
    if (!bVar1) {
      __assert_fail("funcrefTableName",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1290,"Expression *wasm::TranslateToFuzzReader::makeTableSet(Type)");
    }
    type_local.id =
         (uintptr_t)
         TranslateToFuzzReader::makeTableSet::anon_class_8_1_8991fb9c::operator()
                   (&local_30,(Name)(this->funcrefTableName).super_IString.str);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeTableSet(Type type) {
  assert(type == Type::none);

  // Emit a set to either the funcref table (which always exists) or the exnref
  // one (which might not, if EH is disabled).
  auto makeTableSet = [&](Name tableName) {
    auto* table = wasm.getTable(tableName);
    // Usually emit in-bounds sets, to avoid trapping, but rarely allow
    // anything.
    Expression* index;
    if (allowOOB && oneIn(10)) {
      index = make(table->addressType);
    } else {
      index = builder.makeConst(
        Literal::makeFromInt32(upTo(table->initial), table->addressType));
    }
    auto* value = make(table->type);
    return builder.makeTableSet(tableName, index, value);
  };
  if (exnrefTableName && oneIn(2)) {
    return makeTableSet(exnrefTableName);
  } else {
    assert(funcrefTableName);
    return makeTableSet(funcrefTableName);
  }
}